

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_dss.c
# Opt level: O2

void * duckdb_je_extent_alloc_dss
                 (tsdn_t *tsdn,arena_t *arena,void *new_addr,size_t size,size_t alignment,
                 _Bool *zero,_Bool *commit)

{
  char cVar1;
  _Bool _Var2;
  edata_t *edata;
  pac_t *pac;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  ehooks_t *peVar6;
  ulong uVar7;
  void *pvVar8;
  edata_cache_t *edata_cache;
  void *addr;
  spin_t spinner;
  uint uVar9;
  bool bVar10;
  ulong local_c8;
  edata_t local_b0;
  
  if (-1 < (long)size) {
    edata_cache = &(arena->pa_shard).edata_cache;
    edata = duckdb_je_edata_cache_get(tsdn,edata_cache);
    if (edata == (edata_t *)0x0) {
      return (void *)0x0;
    }
    uVar9 = 0;
    while( true ) {
      LOCK();
      bVar10 = dss_extending.repr == false;
      if (bVar10) {
        dss_extending.repr = true;
      }
      UNLOCK();
      if (bVar10) break;
      if (uVar9 < 5) {
        local_b0.e_bits = local_b0.e_bits & 0xffffffff00000000;
        while ((uint)local_b0.e_bits >> ((byte)uVar9 & 0x1f) == 0) {
          local_b0.e_bits = CONCAT44(local_b0.e_bits._4_4_,(uint)local_b0.e_bits + 1);
        }
        uVar9 = uVar9 + 1;
      }
      else {
        sched_yield();
      }
    }
    if ((dss_exhausted.repr & 1U) == 0) {
      pac = &(arena->pa_shard).pac;
      local_c8 = 0x10000e802000;
      do {
        pvVar3 = sbrk(0);
        _Var2 = duckdb_je_opt_retain;
        if (pvVar3 == (void *)0xffffffffffffffff) goto LAB_01e8e846;
        dss_max.repr = pvVar3;
        if ((pvVar3 == (void *)0x0) || (new_addr != (void *)0x0 && pvVar3 != new_addr))
        goto LAB_01e8e846;
        pvVar8 = (void *)((long)pvVar3 + 0xfffU & 0xfffffffffffff000);
        addr = (void *)((alignment - 1) + (long)pvVar8 & -alignment);
        if ((long)addr - (long)pvVar8 != 0) {
          uVar9 = arena->ind;
          sVar4 = duckdb_je_extent_sn_next(pac);
          edata->e_addr = pvVar8;
          (edata->field_2).e_size_esn =
               (ulong)((uint)(edata->field_2).e_size_esn & 0xfff) | (long)addr - (long)pvVar8;
          uVar7 = local_c8;
          if (_Var2 == false) {
            uVar7 = 0xe802000;
          }
          edata->e_sn = sVar4;
          edata->e_bits = (ulong)(uVar9 & 0xf0000fff) | edata->e_bits & 0xffffeffff0000000 | uVar7;
        }
        if (addr < pvVar3) goto LAB_01e8e846;
        pvVar5 = sbrk((size - (long)pvVar3) + (long)addr);
        if (pvVar5 == pvVar3) {
          dss_max.repr = (void *)((long)addr + size);
          dss_extending.repr = false;
          if (pvVar8 == addr) {
            duckdb_je_edata_cache_put(tsdn,edata_cache,edata);
          }
          else {
            peVar6 = duckdb_je_arena_get_ehooks(arena);
            duckdb_je_extent_dalloc_gap(tsdn,pac,peVar6,edata);
          }
          cVar1 = *commit;
          if ((_Bool)cVar1 == false) {
            cVar1 = duckdb_je_pages_decommit(addr,size);
            *commit = (_Bool)cVar1;
          }
          if (*zero != true) {
            return addr;
          }
          if (cVar1 == '\0') {
            return addr;
          }
          local_b0.field_6.e_slab_data.bitmap[5] = 0;
          local_b0.field_6.e_slab_data.bitmap[6] = 0;
          local_b0.field_6.e_slab_data.bitmap[3] = 0;
          local_b0.field_6.e_slab_data.bitmap[4] = 0;
          local_b0.field_6.ql_link_inactive.qre_prev = (edata_t *)0x0;
          local_b0.field_6.e_slab_data.bitmap[2] = 0;
          local_b0.field_5._16_8_ = 0;
          local_b0.field_6.ql_link_inactive.qre_next = (edata_t *)0x0;
          local_b0.field_5.ql_link_active.qre_next = (edata_t *)0x0;
          local_b0.field_5.ql_link_active.qre_prev = (edata_t *)0x0;
          local_b0.e_ps = (hpdata_t *)0x0;
          local_b0.e_sn = 0;
          local_b0.field_6.e_slab_data.bitmap[7] = 0;
          peVar6 = duckdb_je_arena_get_ehooks(arena);
          local_b0.e_bits = 0x100000002000;
          if (_Var2 == false) {
            local_b0.e_bits = 0x2000;
          }
          local_b0.e_sn = 0xe8;
          local_b0.e_bits = ((uint)(size != 0) << 0xc | arena->ind & 0xf0000fff) | local_b0.e_bits;
          local_b0.e_addr = addr;
          local_b0.field_2.e_size_esn = size;
          _Var2 = duckdb_je_extent_purge_forced_wrapper(tsdn,peVar6,&local_b0,0,size);
          if (!_Var2) {
            return addr;
          }
          switchD_014c3389::default(addr,0,size);
          return addr;
        }
      } while (pvVar5 != (void *)0xffffffffffffffff);
      dss_exhausted.repr = true;
    }
LAB_01e8e846:
    dss_extending.repr = false;
    duckdb_je_edata_cache_put(tsdn,edata_cache,edata);
  }
  return (void *)0x0;
}

Assistant:

void *
extent_alloc_dss(tsdn_t *tsdn, arena_t *arena, void *new_addr, size_t size,
    size_t alignment, bool *zero, bool *commit) {
	edata_t *gap;

	cassert(have_dss);
	assert(size > 0);
	assert(alignment == ALIGNMENT_CEILING(alignment, PAGE));

	/*
	 * sbrk() uses a signed increment argument, so take care not to
	 * interpret a large allocation request as a negative increment.
	 */
	if ((intptr_t)size < 0) {
		return NULL;
	}

	gap = edata_cache_get(tsdn, &arena->pa_shard.edata_cache);
	if (gap == NULL) {
		return NULL;
	}

	extent_dss_extending_start();
	if (!atomic_load_b(&dss_exhausted, ATOMIC_ACQUIRE)) {
		/*
		 * The loop is necessary to recover from races with other
		 * threads that are using the DSS for something other than
		 * malloc.
		 */
		while (true) {
			void *max_cur = extent_dss_max_update(new_addr);
			if (max_cur == NULL) {
				goto label_oom;
			}

			bool head_state = opt_retain ? EXTENT_IS_HEAD :
			    EXTENT_NOT_HEAD;
			/*
			 * Compute how much page-aligned gap space (if any) is
			 * necessary to satisfy alignment.  This space can be
			 * recycled for later use.
			 */
			void *gap_addr_page = ALIGNMENT_ADDR2CEILING(max_cur,
			    PAGE);
			void *ret = ALIGNMENT_ADDR2CEILING(
			    gap_addr_page, alignment);
			size_t gap_size_page = (uintptr_t)ret -
			    (uintptr_t)gap_addr_page;
			if (gap_size_page != 0) {
				edata_init(gap, arena_ind_get(arena),
				    gap_addr_page, gap_size_page, false,
				    SC_NSIZES, extent_sn_next(
					&arena->pa_shard.pac),
				    extent_state_active, false, true,
				    EXTENT_PAI_PAC, head_state);
			}
			/*
			 * Compute the address just past the end of the desired
			 * allocation space.
			 */
			void *dss_next = (void *)((byte_t *)ret + size);
			if ((uintptr_t)ret < (uintptr_t)max_cur ||
			    (uintptr_t)dss_next < (uintptr_t)max_cur) {
				goto label_oom; /* Wrap-around. */
			}
			/* Compute the increment, including subpage bytes. */
			void *gap_addr_subpage = max_cur;
			size_t gap_size_subpage = (uintptr_t)ret -
			    (uintptr_t)gap_addr_subpage;
			intptr_t incr = gap_size_subpage + size;

			assert((uintptr_t)max_cur + incr == (uintptr_t)ret +
			    size);

			/* Try to allocate. */
			void *dss_prev = extent_dss_sbrk(incr);
			if (dss_prev == max_cur) {
				/* Success. */
				atomic_store_p(&dss_max, dss_next,
				    ATOMIC_RELEASE);
				extent_dss_extending_finish();

				if (gap_size_page != 0) {
					ehooks_t *ehooks = arena_get_ehooks(
					    arena);
					extent_dalloc_gap(tsdn,
					    &arena->pa_shard.pac, ehooks, gap);
				} else {
					edata_cache_put(tsdn,
					    &arena->pa_shard.edata_cache, gap);
				}
				if (!*commit) {
					*commit = pages_decommit(ret, size);
				}
				if (*zero && *commit) {
					edata_t edata = {0};
					ehooks_t *ehooks = arena_get_ehooks(
					    arena);

					edata_init(&edata,
					    arena_ind_get(arena), ret, size,
					    size, false, SC_NSIZES,
					    extent_state_active, false, true,
					    EXTENT_PAI_PAC, head_state);
					if (extent_purge_forced_wrapper(tsdn,
					    ehooks, &edata, 0, size)) {
						memset(ret, 0, size);
					}
				}
				return ret;
			}
			/*
			 * Failure, whether due to OOM or a race with a raw
			 * sbrk() call from outside the allocator.
			 */
			if (dss_prev == SBRK_INVALID) {
				/* OOM. */
				atomic_store_b(&dss_exhausted, true,
				    ATOMIC_RELEASE);
				goto label_oom;
			}
		}
	}
label_oom:
	extent_dss_extending_finish();
	edata_cache_put(tsdn, &arena->pa_shard.edata_cache, gap);
	return NULL;
}